

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

bool __thiscall
cmLocalUnixMakefileGenerator3::UpdateDependencies
          (cmLocalUnixMakefileGenerator3 *this,char *tgtInfo,bool verbose,bool color)

{
  cmFileTimeComparison *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  allocator local_6a9;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  validDependencies;
  int result_1;
  undefined4 uStack_674;
  string dirInfoFile;
  string internalDependFile;
  string dir;
  string dependFile;
  ostringstream msg;
  
  bVar1 = cmMakefile::ReadListFile
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,tgtInfo);
  if ((!bVar1) || (bVar1 = cmSystemTools::GetErrorOccuredFlag(), bVar1)) {
    cmSystemTools::Error
              ("Target DependInfo.cmake file not found",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  CheckMultipleOutputs(this,verbose);
  std::__cxx11::string::string((string *)&msg,tgtInfo,(allocator *)&validDependencies);
  cmsys::SystemTools::GetFilenamePath(&dir,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  std::operator+(&internalDependFile,&dir,"/depend.internal");
  std::operator+(&dependFile,&dir,"/depend.make");
  this_00 = ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            CMakeInstance->FileComparison;
  bVar1 = cmFileTimeComparison::FileTimeCompare
                    (this_00,internalDependFile._M_dataplus._M_p,tgtInfo,(int *)&dirInfoFile);
  bVar7 = -1 < (int)dirInfoFile._M_dataplus._M_p;
  if (verbose && (!bVar1 || !bVar7)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar5 = std::operator<<((ostream *)&msg,"Dependee \"");
    poVar5 = std::operator<<(poVar5,tgtInfo);
    poVar5 = std::operator<<(poVar5,"\" is newer than depender \"");
    poVar5 = std::operator<<(poVar5,(string *)&internalDependFile);
    poVar5 = std::operator<<(poVar5,"\".");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((char *)validDependencies._M_t._M_impl._0_8_);
    std::__cxx11::string::~string((string *)&validDependencies);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&dirInfoFile,pcVar6,(allocator *)&msg);
  std::__cxx11::string::append((char *)&dirInfoFile);
  std::__cxx11::string::append((char *)&dirInfoFile);
  bVar2 = cmFileTimeComparison::FileTimeCompare
                    (this_00,internalDependFile._M_dataplus._M_p,
                     (char *)CONCAT44(dirInfoFile._M_dataplus._M_p._4_4_,
                                      (int)dirInfoFile._M_dataplus._M_p),&result_1);
  bVar8 = result_1 < 0;
  if (!bVar2 || bVar8) {
    if (verbose) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      poVar5 = std::operator<<((ostream *)&msg,"Dependee \"");
      poVar5 = std::operator<<(poVar5,(string *)&dirInfoFile);
      poVar5 = std::operator<<(poVar5,"\" is newer than depender \"");
      poVar5 = std::operator<<(poVar5,(string *)&internalDependFile);
      poVar5 = std::operator<<(poVar5,"\".");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout((char *)validDependencies._M_t._M_impl._0_8_);
      std::__cxx11::string::~string((string *)&validDependencies);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
    }
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &validDependencies._M_t._M_impl.super__Rb_tree_header._M_header;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &validDependencies._M_t._M_impl.super__Rb_tree_header._M_header;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    cmDependsC::cmDependsC((cmDependsC *)&msg);
    bVar3 = cmDepends::Check((cmDepends *)&msg,dependFile._M_dataplus._M_p,
                             internalDependFile._M_dataplus._M_p,&validDependencies);
    cmDependsC::~cmDependsC((cmDependsC *)&msg);
    bVar4 = true;
    if ((bVar1 && bVar7) && ((bVar2 && !bVar8) && bVar3)) goto LAB_003e449c;
  }
  cmsys::SystemTools::GetFilenameName((string *)&msg,&dir);
  std::__cxx11::string::substr((ulong)&result_1,(ulong)&msg);
  std::__cxx11::string::operator=((string *)&msg,(string *)&result_1);
  std::__cxx11::string::~string((string *)&result_1);
  std::__cxx11::string::string((string *)&result_1,"Scanning dependencies of target ",&local_6a9);
  std::__cxx11::string::append((string *)&result_1);
  cmSystemTools::MakefileColorEcho(0x106,(char *)CONCAT44(uStack_674,result_1),true,color);
  bVar4 = ScanDependencies(this,dir._M_dataplus._M_p,&validDependencies);
  std::__cxx11::string::~string((string *)&result_1);
  std::__cxx11::string::~string((string *)&msg);
LAB_003e449c:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  ::~_Rb_tree(&validDependencies._M_t);
  std::__cxx11::string::~string((string *)&dirInfoFile);
  std::__cxx11::string::~string((string *)&dependFile);
  std::__cxx11::string::~string((string *)&internalDependFile);
  std::__cxx11::string::~string((string *)&dir);
  return bVar4;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::UpdateDependencies(const char* tgtInfo,
                                                       bool verbose,
                                                       bool color)
{
  // read in the target info file
  if (!this->Makefile->ReadListFile(tgtInfo) ||
      cmSystemTools::GetErrorOccuredFlag()) {
    cmSystemTools::Error("Target DependInfo.cmake file not found");
  }

  // Check if any multiple output pairs have a missing file.
  this->CheckMultipleOutputs(verbose);

  std::string dir = cmSystemTools::GetFilenamePath(tgtInfo);
  std::string internalDependFile = dir + "/depend.internal";
  std::string dependFile = dir + "/depend.make";

  // If the target DependInfo.cmake file has changed since the last
  // time dependencies were scanned then force rescanning.  This may
  // happen when a new source file is added and CMake regenerates the
  // project but no other sources were touched.
  bool needRescanDependInfo = false;
  cmFileTimeComparison* ftc =
    this->GlobalGenerator->GetCMakeInstance()->GetFileComparison();
  {
    int result;
    if (!ftc->FileTimeCompare(internalDependFile.c_str(), tgtInfo, &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << tgtInfo << "\" is newer than depender \""
            << internalDependFile << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str().c_str());
      }
      needRescanDependInfo = true;
    }
  }

  // If the directory information is newer than depend.internal, include dirs
  // may have changed. In this case discard all old dependencies.
  bool needRescanDirInfo = false;
  std::string dirInfoFile = this->GetCurrentBinaryDirectory();
  dirInfoFile += cmake::GetCMakeFilesDirectory();
  dirInfoFile += "/CMakeDirectoryInformation.cmake";
  {
    int result;
    if (!ftc->FileTimeCompare(internalDependFile.c_str(), dirInfoFile.c_str(),
                              &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << dirInfoFile << "\" is newer than depender \""
            << internalDependFile << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str().c_str());
      }
      needRescanDirInfo = true;
    }
  }

  // Check the implicit dependencies to see if they are up to date.
  // The build.make file may have explicit dependencies for the object
  // files but these will not affect the scanning process so they need
  // not be considered.
  std::map<std::string, cmDepends::DependencyVector> validDependencies;
  bool needRescanDependencies = false;
  if (!needRescanDirInfo) {
    cmDependsC checker;
    checker.SetVerbose(verbose);
    checker.SetFileComparison(ftc);
    // cmDependsC::Check() fills the vector validDependencies() with the
    // dependencies for those files where they are still valid, i.e. neither
    // the files themselves nor any files they depend on have changed.
    // We don't do that if the CMakeDirectoryInformation.cmake file has
    // changed, because then potentially all dependencies have changed.
    // This information is given later on to cmDependsC, which then only
    // rescans the files where it did not get valid dependencies via this
    // dependency vector. This means that in the normal case, when only
    // few or one file have been edited, then also only this one file is
    // actually scanned again, instead of all files for this target.
    needRescanDependencies = !checker.Check(
      dependFile.c_str(), internalDependFile.c_str(), validDependencies);
  }

  if (needRescanDependInfo || needRescanDirInfo || needRescanDependencies) {
    // The dependencies must be regenerated.
    std::string targetName = cmSystemTools::GetFilenameName(dir);
    targetName = targetName.substr(0, targetName.length() - 4);
    std::string message = "Scanning dependencies of target ";
    message += targetName;
    cmSystemTools::MakefileColorEcho(cmsysTerminal_Color_ForegroundMagenta |
                                       cmsysTerminal_Color_ForegroundBold,
                                     message.c_str(), true, color);

    return this->ScanDependencies(dir.c_str(), validDependencies);
  }

  // The dependencies are already up-to-date.
  return true;
}